

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O2

char * irafrdhead(char *filename,int *lihead)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  uint uVar3;
  char *pcVar4;
  char errmsg [81];
  
  *lihead = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar4 = "unable to open IRAF header file:";
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == 0) {
      sVar2 = ftell(__stream);
      if ((long)sVar2 < 0) {
        pcVar4 = "IRAFRHEAD: cannot get pos. in file:";
      }
      else {
        iVar1 = fseek(__stream,0,0);
        if (iVar1 == 0) {
          uVar3 = (int)sVar2 + 5000;
          pcVar4 = (char *)calloc(1,(long)(int)uVar3);
          if (pcVar4 == (char *)0x0) {
            snprintf(errmsg,0x51,"IRAFRHEAD Cannot allocate %d-byte header",(ulong)uVar3);
            ffpmsg(errmsg);
            ffpmsg(filename);
            return (char *)0x0;
          }
          *lihead = uVar3;
          sVar2 = fread(pcVar4,1,sVar2,__stream);
          fclose(__stream);
          if ((int)sVar2 < 0x400) {
            snprintf(errmsg,0x51,"IRAFRHEAD header file: %d / %d bytes read.",sVar2 & 0xffffffff,
                     0x400);
            ffpmsg(errmsg);
            ffpmsg(filename);
            free(pcVar4);
            return (char *)0x0;
          }
          return pcVar4;
        }
        pcVar4 = "IRAFRHEAD: cannot seek to beginning of file:";
      }
    }
    else {
      pcVar4 = "IRAFRHEAD: cannot seek in file:";
    }
  }
  ffpmsg(pcVar4);
  ffpmsg(filename);
  return (char *)0x0;
}

Assistant:

static char *irafrdhead (
    const char *filename,  /* Name of IRAF header file */
    int *lihead)           /* Length of IRAF image header in bytes (returned) */
{
    FILE *fd;
    int nbr;
    char *irafheader;
    char errmsg[FLEN_ERRMSG];
    long nbhead;
    int nihead;

    *lihead = 0;

    /* open the image header file */
    fd = fopen (filename, "rb");
    if (fd == NULL) {
        ffpmsg("unable to open IRAF header file:");
        ffpmsg(filename);
	return (NULL);
	}

    /* Find size of image header file */
    if (fseek(fd, 0, 2) != 0)  /* move to end of the file */
    {
        ffpmsg("IRAFRHEAD: cannot seek in file:");
        ffpmsg(filename);
        return(NULL);
    }

    nbhead = ftell(fd);     /* position = size of file */
    if (nbhead < 0)
    {
        ffpmsg("IRAFRHEAD: cannot get pos. in file:");
        ffpmsg(filename);
        return(NULL);
    }

    if (fseek(fd, 0, 0) != 0) /* move back to beginning */
    {
        ffpmsg("IRAFRHEAD: cannot seek to beginning of file:");
        ffpmsg(filename);
        return(NULL);
    }

    /* allocate initial sized buffer */
    nihead = nbhead + 5000;
    irafheader = (char *) calloc (1, nihead);
    if (irafheader == NULL) {
	snprintf(errmsg, FLEN_ERRMSG,"IRAFRHEAD Cannot allocate %d-byte header",
		      nihead);
        ffpmsg(errmsg);
        ffpmsg(filename);
	return (NULL);
	}
    *lihead = nihead;

    /* Read IRAF header */
    nbr = fread (irafheader, 1, nbhead, fd);
    fclose (fd);

    /* Reject if header less than minimum length */
    if (nbr < LEN_PIXHDR) {
	snprintf(errmsg, FLEN_ERRMSG,"IRAFRHEAD header file: %d / %d bytes read.",
		      nbr,LEN_PIXHDR);
        ffpmsg(errmsg);
        ffpmsg(filename);
	free (irafheader);
	return (NULL);
	}

    return (irafheader);
}